

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::Camera::writeTo(Camera *this,BinaryWriter *binary)

{
  BinaryWriter::write<float>(binary,&this->fov);
  BinaryWriter::write<float>(binary,&this->focalDistance);
  BinaryWriter::write<float>(binary,&this->lensRadius);
  BinaryWriter::write<pbrt::math::affine3f>(binary,&this->frame);
  BinaryWriter::write<pbrt::Camera::_unnamed_type_1_>(binary,&this->simplified);
  return 5;
}

Assistant:

int Camera::writeTo(BinaryWriter &binary) 
  {
    binary.write(fov);
    binary.write(focalDistance);
    binary.write(lensRadius);
    binary.write(frame);
    binary.write(simplified);
    return TYPE_CAMERA;
  }